

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcherHelper::~EventDispatcherHelper(EventDispatcherHelper *this)

{
  bool bVar1;
  EventListenerNode **ppEVar2;
  undefined1 local_20 [16];
  iterator i;
  EventDispatcherHelper *this_local;
  
  i.mNode = (Node *)this;
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::begin
            ((list<EventDispatcherHelper::EventListenerNode_*> *)(local_20 + 8));
  while( true ) {
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::end
              ((list<EventDispatcherHelper::EventListenerNode_*> *)local_20);
    bVar1 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator!=
                      ((iterator *)(local_20 + 8),(iterator *)local_20);
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
              ((iterator *)local_20);
    if (!bVar1) break;
    ppEVar2 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                        ((iterator *)(local_20 + 8));
    if (*ppEVar2 != (EventListenerNode *)0x0) {
      operator_delete(*ppEVar2,0x10);
    }
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator++
              ((iterator *)(local_20 + 8));
  }
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
            ((iterator *)(local_20 + 8));
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::clear(&this->mEventList);
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::~list(&this->mEventList);
  Mutex::~Mutex(&this->mLock);
  return;
}

Assistant:

EventDispatcherHelper::~EventDispatcherHelper()
{
	TRACE_BEGIN(LOG_LVL_INFO);

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		delete *i;
	}

	mEventList.clear();
}